

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O0

void duckdb::StringColumnReader::VerifyString(char *str_data,uint32_t str_len,bool is_varchar)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte in_DL;
  uint in_ESI;
  char *in_RDI;
  string_t sVar1;
  UnicodeType utf_type;
  size_t pos;
  UnicodeInvalidReason reason;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff5c;
  uint32_t in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  string_t *in_stack_ffffffffffffff70;
  undefined1 local_88 [64];
  string local_48 [36];
  int local_24;
  ulong local_20;
  UnicodeInvalidReason local_14;
  byte local_d;
  
  local_d = in_DL & 1;
  if ((local_d != 0) &&
     (local_24 = duckdb::Utf8Proc::Analyze(in_RDI,(ulong)in_ESI,&local_14,&local_20), local_24 == 0)
     ) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    string_t::string_t(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
                      );
    sVar1.value.pointer.ptr = in_stack_ffffffffffffff68;
    sVar1.value._0_8_ = local_88;
    duckdb::Blob::ToString_abi_cxx11_(sVar1);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffff5c,uVar2),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff5c,uVar2),(char *)__rhs);
    duckdb::InvalidInputException::InvalidInputException((InvalidInputException *)__rhs,local_48);
    __cxa_throw(__rhs,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  return;
}

Assistant:

void StringColumnReader::VerifyString(const char *str_data, uint32_t str_len, const bool is_varchar) {
	if (!is_varchar) {
		return;
	}
	// verify if a string is actually UTF8, and if there are no null bytes in the middle of the string
	// technically Parquet should guarantee this, but reality is often disappointing
	UnicodeInvalidReason reason;
	size_t pos;
	auto utf_type = Utf8Proc::Analyze(str_data, str_len, &reason, &pos);
	if (utf_type == UnicodeType::INVALID) {
		throw InvalidInputException("Invalid string encoding found in Parquet file: value \"" +
		                            Blob::ToString(string_t(str_data, str_len)) + "\" is not valid UTF8!");
	}
}